

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O1

_Bool array_array_container_lazy_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  int iVar2;
  array_container_t *out;
  bitset_container_t *pbVar3;
  size_t sVar4;
  _Bool _Var5;
  int iVar6;
  bitset_container_t *ourbitset;
  
  iVar1 = src_1->cardinality;
  iVar2 = src_2->cardinality;
  iVar6 = iVar2 + iVar1;
  *dst = (container_t *)0x0;
  if (iVar6 < 0x401) {
    if (src_1->capacity < iVar6) {
      out = array_container_create_given_capacity(iVar6 * 2);
      *dst = out;
      if (out == (array_container_t *)0x0) {
        return true;
      }
      array_container_union(src_1,src_2,out);
    }
    else {
      memmove(src_1->array + iVar2,src_1->array,(long)iVar1 * 2);
      sVar4 = fast_union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,
                                src_2->array,(long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar4;
    }
    _Var5 = false;
  }
  else {
    pbVar3 = bitset_container_create();
    *dst = pbVar3;
    _Var5 = true;
    if (pbVar3 != (bitset_container_t *)0x0) {
      bitset_set_list(pbVar3->words,src_1->array,(long)src_1->cardinality);
      bitset_set_list(pbVar3->words,src_2->array,(long)src_2->cardinality);
      pbVar3->cardinality = -1;
    }
  }
  return _Var5;
}

Assistant:

bool array_array_container_lazy_inplace_union(array_container_t *src_1,
                                              const array_container_t *src_2,
                                              container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    //
    // We assume that operations involving bitset containers will be faster than
    // operations involving solely array containers, except maybe when array
    // containers are small. Indeed, for example, it is cheap to compute the
    // union between an array and a bitset container, generally more so than
    // between a large array and another array. So it is advantageous to favour
    // bitset containers during the computation. Of course, if we convert array
    // containers eagerly to bitset containers, we may later need to revert the
    // bitset containers to array containerr to satisfy the Roaring format
    // requirements, but such one-time conversions at the end may not be overly
    // expensive. We arrived to this design based on extensive benchmarking.
    //
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        if (src_1->capacity < totalCardinality) {
            *dst = array_container_create_given_capacity(
                2 * totalCardinality);  // be purposefully generous
            if (*dst != NULL) {
                array_container_union(src_1, src_2, CAST_array(*dst));
            } else {
                return true;  // otherwise failure won't be caught
            }
            return false;  // not a bitset
        } else {
            memmove(src_1->array + src_2->cardinality, src_1->array,
                    src_1->cardinality * sizeof(uint16_t));
            /*
              Next line is safe:

              We just need to focus on the reading and writing performed on
              array1. In `union_vector16`, both vectorized and scalar code still
              obey the basic rule: read from two inputs, do the union, and then
              write the output.

              Let's say the length(cardinality) of input2 is L2:
              ```
                  |<-  L2  ->|
              array1: [output--- |input 1---|---]
              array2: [input 2---]
              ```
              Let's define 3 __m128i pointers, `pos1` starts from `input1`,
              `pos2` starts from `input2`, these 2 point at the next byte to
              read, `out` starts from `output`, pointing at the next byte to
              overwrite.
              ```
              array1: [output--- |input 1---|---]
                          ^          ^
                      out        pos1
              array2: [input 2---]
                          ^
                          pos2
              ```
              The union output always contains less or equal number of elements
              than all inputs added, so we have:
              ```
              out <= pos1 + pos2
              ```
              therefore:
              ```
              out <= pos1 + L2
              ```
              which means you will not overwrite data beyond pos1, so the data
              haven't read is safe, and we don't care the data already read.
            */
            src_1->cardinality = (int32_t)fast_union_uint16(
                src_1->array + src_2->cardinality, src_1->cardinality,
                src_2->array, src_2->cardinality, src_1->array);
            return false;  // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}